

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterFlushPMA(VdbeSorter *pSorter)

{
  int iVar1;
  void *pvVar2;
  SorterList *in_RDI;
  void *pCtx;
  u8 *aMem;
  int iTest;
  int nWorker;
  SortSubtask *pTask;
  int i;
  int rc;
  SortSubtask *in_stack_ffffffffffffffd0;
  SortSubtask *pTask_00;
  SorterList *local_20;
  int local_18;
  int local_14;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_14 = 0;
  local_20 = (SorterList *)0x0;
  iVar1 = *(byte *)((long)&in_RDI[3].szPMA + 3) - 1;
  *(undefined1 *)&in_RDI[3].szPMA = 1;
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    local_20 = in_RDI + (long)((int)((uint)*(byte *)((long)&in_RDI[3].szPMA + 2) + local_18 + 1) %
                              iVar1) * 4 + 4;
    if (*(int *)&local_20->aMemory != 0) {
      local_14 = vdbeSorterJoinThread(in_stack_ffffffffffffffd0);
    }
    if ((local_14 != 0) || (local_20->pList == (SorterRecord *)0x0)) break;
  }
  if (local_14 == 0) {
    if (local_18 == iVar1) {
      local_14 = vdbeSorterListToPMA((SortSubtask *)
                                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                     in_RDI);
    }
    else {
      pTask_00 = (SortSubtask *)local_20[1].szPMA;
      *(char *)((long)&in_RDI[3].szPMA + 2) = (char)(((long)local_20 - (long)(in_RDI + 4)) / 0x60);
      local_20[1].aMemory = in_RDI[2].aMemory;
      local_20[1].szPMA = in_RDI[2].szPMA;
      local_20[2].pList = in_RDI[3].pList;
      in_RDI[2].aMemory = (u8 *)0x0;
      in_RDI[3].pList = (SorterRecord *)0x0;
      if (pTask_00 == (SortSubtask *)0x0) {
        if (in_RDI[2].szPMA != 0) {
          pvVar2 = sqlite3Malloc(0);
          in_RDI[2].szPMA = (i64)pvVar2;
          if (in_RDI[2].szPMA == 0) {
            return 7;
          }
        }
      }
      else {
        in_RDI[2].szPMA = (i64)pTask_00;
        iVar1 = sqlite3MallocSize((void *)0x198f22);
        *(int *)((long)&in_RDI[3].aMemory + 4) = iVar1;
      }
      local_14 = vdbeSorterCreateThread
                           (pTask_00,(_func_void_ptr_void_ptr *)local_20,(void *)0x198f83);
    }
  }
  return local_14;
}

Assistant:

static int vdbeSorterFlushPMA(VdbeSorter *pSorter){
#if SQLITE_MAX_WORKER_THREADS==0
  pSorter->bUsePMA = 1;
  return vdbeSorterListToPMA(&pSorter->aTask[0], &pSorter->list);
#else
  int rc = SQLITE_OK;
  int i;
  SortSubtask *pTask = 0;    /* Thread context used to create new PMA */
  int nWorker = (pSorter->nTask-1);

  /* Set the flag to indicate that at least one PMA has been written.
  ** Or will be, anyhow.  */
  pSorter->bUsePMA = 1;

  /* Select a sub-task to sort and flush the current list of in-memory
  ** records to disk. If the sorter is running in multi-threaded mode,
  ** round-robin between the first (pSorter->nTask-1) tasks. Except, if
  ** the background thread from a sub-tasks previous turn is still running,
  ** skip it. If the first (pSorter->nTask-1) sub-tasks are all still busy,
  ** fall back to using the final sub-task. The first (pSorter->nTask-1)
  ** sub-tasks are preferred as they use background threads - the final
  ** sub-task uses the main thread. */
  for(i=0; i<nWorker; i++){
    int iTest = (pSorter->iPrev + i + 1) % nWorker;
    pTask = &pSorter->aTask[iTest];
    if( pTask->bDone ){
      rc = vdbeSorterJoinThread(pTask);
    }
    if( rc!=SQLITE_OK || pTask->pThread==0 ) break;
  }

  if( rc==SQLITE_OK ){
    if( i==nWorker ){
      /* Use the foreground thread for this operation */
      rc = vdbeSorterListToPMA(&pSorter->aTask[nWorker], &pSorter->list);
    }else{
      /* Launch a background thread for this operation */
      u8 *aMem;
      void *pCtx;

      assert( pTask!=0 );
      assert( pTask->pThread==0 && pTask->bDone==0 );
      assert( pTask->list.pList==0 );
      assert( pTask->list.aMemory==0 || pSorter->list.aMemory!=0 );

      aMem = pTask->list.aMemory;
      pCtx = (void*)pTask;
      pSorter->iPrev = (u8)(pTask - pSorter->aTask);
      pTask->list = pSorter->list;
      pSorter->list.pList = 0;
      pSorter->list.szPMA = 0;
      if( aMem ){
        pSorter->list.aMemory = aMem;
        pSorter->nMemory = sqlite3MallocSize(aMem);
      }else if( pSorter->list.aMemory ){
        pSorter->list.aMemory = sqlite3Malloc(pSorter->nMemory);
        if( !pSorter->list.aMemory ) return SQLITE_NOMEM_BKPT;
      }

      rc = vdbeSorterCreateThread(pTask, vdbeSorterFlushThread, pCtx);
    }
  }

  return rc;
#endif /* SQLITE_MAX_WORKER_THREADS!=0 */
}